

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O1

void FastPForLib::Simple16<false>::unpack5_4_4_2(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *out;
  puVar2 = *in;
  *puVar1 = *puVar2 >> 0x17 & 0x1f;
  puVar1[1] = *puVar2 >> 0x12 & 0x1f;
  puVar1[2] = *puVar2 >> 0xd & 0x1f;
  puVar1[3] = *puVar2 >> 8 & 0x1f;
  puVar1[4] = *puVar2 >> 4 & 0xf;
  puVar1[5] = *puVar2 & 0xf;
  *in = puVar2 + 1;
  *out = puVar1 + 6;
  return;
}

Assistant:

void Simple16<MarkLength>::unpack5_4_4_2(uint32_t **out, const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 23) & 0x1f;
  pout[1] = (pin[0] >> 18) & 0x1f;
  pout[2] = (pin[0] >> 13) & 0x1f;
  pout[3] = (pin[0] >> 8) & 0x1f;

  pout[4] = (pin[0] >> 4) & 0x0f;
  pout[5] = pin[0] & 0x0f;

  *in = pin + 1;
  *out = pout + 6;
}